

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

void opj_tcd_makelayer(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_FLOAT64 thresh,OPJ_UINT32 final)

{
  opj_tcd_cblk_enc_t *poVar1;
  uint uVar2;
  uint uVar3;
  opj_tcd_tile_t *poVar4;
  opj_tcd_tilecomp_t *poVar5;
  opj_tcd_resolution_t *poVar6;
  opj_tcd_precinct_t *poVar7;
  opj_tcd_cblk_enc_t *poVar8;
  opj_tcd_pass_t *poVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  OPJ_FLOAT64 *pOVar19;
  OPJ_UINT32 OVar20;
  uint uVar21;
  OPJ_BYTE *pOVar22;
  ulong uVar23;
  ulong uVar24;
  opj_tcd_layer_t *poVar25;
  uint uVar26;
  double dVar27;
  OPJ_FLOAT64 OVar28;
  
  poVar4 = tcd->tcd_image->tiles;
  poVar4->distolayer[layno] = 0.0;
  uVar2 = poVar4->numcomps;
  if ((ulong)uVar2 != 0) {
    poVar5 = poVar4->comps;
    uVar16 = 0;
    do {
      uVar18 = (ulong)poVar5[uVar16].numresolutions;
      if (uVar18 != 0) {
        poVar6 = poVar5[uVar16].resolutions;
        uVar15 = 0;
        do {
          uVar3 = poVar6[uVar15].numbands;
          if ((ulong)uVar3 != 0) {
            uVar14 = 0;
            do {
              if (((poVar6[uVar15].bands[uVar14].x1 != poVar6[uVar15].bands[uVar14].x0) &&
                  (poVar6[uVar15].bands[uVar14].y1 != poVar6[uVar15].bands[uVar14].y0)) &&
                 (uVar11 = poVar6[uVar15].ph * poVar6[uVar15].pw, uVar11 != 0)) {
                poVar7 = poVar6[uVar15].bands[uVar14].precincts;
                uVar13 = 0;
                do {
                  uVar12 = poVar7[uVar13].ch * poVar7[uVar13].cw;
                  if (uVar12 != 0) {
                    uVar23 = 0;
                    do {
                      poVar8 = poVar7[uVar13].cblks.enc;
                      poVar1 = poVar8 + uVar23;
                      if (layno == 0) {
                        poVar1->numpassesinlayers = 0;
                      }
                      poVar25 = poVar8[uVar23].layers + layno;
                      if (0.0 <= (double)thresh) {
                        uVar26 = poVar1->numpassesinlayers;
                        uVar24 = (ulong)uVar26;
                        if (uVar26 < poVar1->totalpasses) {
                          poVar9 = poVar1->passes;
                          pOVar19 = &poVar9[uVar24].distortiondec;
                          uVar21 = uVar26;
                          do {
                            uVar17 = ((opj_tcd_pass_t *)(pOVar19 + -1))->rate;
                            if (uVar21 == 0) {
                              dVar27 = (double)*pOVar19;
                            }
                            else {
                              uVar17 = uVar17 - poVar9[uVar21 - 1].rate;
                              dVar27 = (double)*pOVar19 - (double)poVar9[uVar21 - 1].distortiondec;
                            }
                            if (uVar17 == 0) {
                              bVar10 = dVar27 != 0.0;
                            }
                            else {
                              bVar10 = (double)thresh - dVar27 / (double)uVar17 <
                                       2.220446049250313e-16;
                            }
                            uVar24 = uVar24 + 1;
                            uVar17 = (uint)uVar24;
                            if (!bVar10) {
                              uVar17 = uVar21;
                            }
                            pOVar19 = pOVar19 + 3;
                            uVar21 = uVar17;
                          } while (poVar1->totalpasses != uVar24);
                          goto LAB_00136ac1;
                        }
                        poVar25->numpasses = 0;
LAB_00136b07:
                        poVar25->disto = 0.0;
                      }
                      else {
                        uVar26 = poVar1->numpassesinlayers;
                        uVar17 = poVar1->totalpasses;
LAB_00136ac1:
                        poVar25->numpasses = uVar17 - uVar26;
                        if (uVar17 - uVar26 == 0) goto LAB_00136b07;
                        uVar21 = uVar17 - 1;
                        poVar9 = poVar1->passes;
                        OVar20 = poVar9[uVar21].rate;
                        if (uVar26 == 0) {
                          pOVar22 = poVar1->data;
                          OVar28 = poVar9[uVar21].distortiondec;
                        }
                        else {
                          OVar20 = OVar20 - poVar9[uVar26 - 1].rate;
                          pOVar22 = poVar1->data + poVar9[uVar26 - 1].rate;
                          OVar28 = (OPJ_FLOAT64)
                                   ((double)poVar9[uVar21].distortiondec -
                                   (double)poVar9[uVar26 - 1].distortiondec);
                        }
                        poVar25->len = OVar20;
                        poVar25->data = pOVar22;
                        poVar25->disto = OVar28;
                        poVar4->distolayer[layno] =
                             (OPJ_FLOAT64)((double)OVar28 + (double)poVar4->distolayer[layno]);
                        if (final != 0) {
                          poVar1->numpassesinlayers = uVar17;
                        }
                      }
                      uVar23 = uVar23 + 1;
                    } while (uVar23 != uVar12);
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 != uVar11);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar3);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar18);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar2);
  }
  return;
}

Assistant:

void opj_tcd_makelayer(opj_tcd_t *tcd,
                       OPJ_UINT32 layno,
                       OPJ_FLOAT64 thresh,
                       OPJ_UINT32 final)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;
    OPJ_UINT32 passno;

    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;

    tcd_tile->distolayer[layno] = 0;        /* fixed_quality */

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                        opj_tcd_layer_t *layer = &cblk->layers[layno];
                        OPJ_UINT32 n;

                        if (layno == 0) {
                            cblk->numpassesinlayers = 0;
                        }

                        n = cblk->numpassesinlayers;

                        if (thresh < 0) {
                            /* Special value to indicate to use all passes */
                            n = cblk->totalpasses;
                        } else {
                            for (passno = cblk->numpassesinlayers; passno < cblk->totalpasses; passno++) {
                                OPJ_UINT32 dr;
                                OPJ_FLOAT64 dd;
                                opj_tcd_pass_t *pass = &cblk->passes[passno];

                                if (n == 0) {
                                    dr = pass->rate;
                                    dd = pass->distortiondec;
                                } else {
                                    dr = pass->rate - cblk->passes[n - 1].rate;
                                    dd = pass->distortiondec - cblk->passes[n - 1].distortiondec;
                                }

                                if (!dr) {
                                    if (dd != 0) {
                                        n = passno + 1;
                                    }
                                    continue;
                                }
                                if (thresh - (dd / dr) <
                                        DBL_EPSILON) { /* do not rely on float equality, check with DBL_EPSILON margin */
                                    n = passno + 1;
                                }
                            }
                        }

                        layer->numpasses = n - cblk->numpassesinlayers;

                        if (!layer->numpasses) {
                            layer->disto = 0;
                            continue;
                        }

                        if (cblk->numpassesinlayers == 0) {
                            layer->len = cblk->passes[n - 1].rate;
                            layer->data = cblk->data;
                            layer->disto = cblk->passes[n - 1].distortiondec;
                        } else {
                            layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers -
                                         1].rate;
                            layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                            layer->disto = cblk->passes[n - 1].distortiondec -
                                           cblk->passes[cblk->numpassesinlayers - 1].distortiondec;
                        }

                        tcd_tile->distolayer[layno] += layer->disto;    /* fixed_quality */

                        if (final) {
                            cblk->numpassesinlayers = n;
                        }
                    }
                }
            }
        }
    }
}